

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

bool fmt::v10::detail::check_char_specs<char>(format_specs<char> *specs)

{
  bool bVar1;
  
  bVar1 = false;
  if (((specs->type < 0x13) && (bVar1 = false, (0x48001U >> (specs->type & 0x1f) & 1) != 0)) &&
     (bVar1 = true,
     (*(ushort *)&specs->field_0x9 & 0xf) == 4 || (*(ushort *)&specs->field_0x9 & 0xf0) != 0)) {
    throw_format_error("invalid format specifier for char");
  }
  return bVar1;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const format_specs<Char>& specs) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr &&
      specs.type != presentation_type::debug) {
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    throw_format_error("invalid format specifier for char");
  return true;
}